

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_edge.c
# Opt level: O0

REF_STATUS
ref_edge_rcm_queue_node(REF_INT node,REF_INT degree,REF_INT *queue,REF_INT *nqueue,REF_INT *nhere)

{
  int local_30;
  int local_2c;
  REF_INT insert_point;
  REF_INT location;
  REF_INT *nhere_local;
  REF_INT *nqueue_local;
  REF_INT *queue_local;
  REF_INT degree_local;
  REF_INT node_local;
  
  local_30 = *nhere;
  local_2c = 0;
  do {
    if (*nhere <= local_2c) {
LAB_0020bfbd:
      for (local_2c = *nqueue; local_30 < local_2c; local_2c = local_2c + -1) {
        queue[local_2c << 1] = queue[(local_2c + -1) * 2];
        queue[local_2c * 2 + 1] = queue[(local_2c + -1) * 2 + 1];
      }
      queue[local_30 << 1] = node;
      queue[local_30 * 2 + 1] = degree;
      *nqueue = *nqueue + 1;
      *nhere = *nhere + 1;
      return 0;
    }
    if (queue[local_2c * 2 + 1] < degree) {
      local_30 = local_2c;
      goto LAB_0020bfbd;
    }
    local_2c = local_2c + 1;
  } while( true );
}

Assistant:

REF_FCN static REF_STATUS ref_edge_rcm_queue_node(REF_INT node, REF_INT degree,
                                                  REF_INT *queue,
                                                  REF_INT *nqueue,
                                                  REF_INT *nhere) {
  REF_INT location, insert_point;

  /* largest degree first, will dequeue smallest from end of array */

  insert_point = *nhere;
  for (location = 0; location < (*nhere); location++) {
    if (queue[1 + 2 * location] < degree) {
      insert_point = location;
      break;
    }
  }

  for (location = (*nqueue); location > insert_point; location--) {
    queue[0 + 2 * location] = queue[0 + 2 * (location - 1)];
    queue[1 + 2 * location] = queue[1 + 2 * (location - 1)];
  }

  queue[0 + 2 * insert_point] = node;
  queue[1 + 2 * insert_point] = degree;
  (*nqueue)++;

  (*nhere)++;

  /*
  printf("nqueue %d of %d (%d) ins %d\n", *nqueue, node, degree, insert_point);
  for (location = 0; location < (*nqueue); location++) {
    printf("%d: %d (%d)\n", location, queue[0 + 2 * location],
           queue[1 + 2 * location]);
  }
  */

  return REF_SUCCESS;
}